

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O2

void __thiscall ColorToGray::handleToken(ColorToGray *this,Token *token)

{
  deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_> *this_00;
  deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_> *this_01;
  token_type_e tVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  ColorToGray *pCVar5;
  double dVar6;
  double dVar7;
  allocator<char> local_59;
  string local_58;
  double local_38;
  double local_30;
  
  this_00 = &this->all_stack;
  while ((this->all_stack).
         super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->all_stack).
         super__Deque_base<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_00,0);
    if (1 < pvVar3->type - tt_space) break;
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_00,0);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(this_00);
  }
  std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::push_back(this_00,token);
  if (1 < token->type - tt_space) {
    this_01 = &this->stack;
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::push_back
              (this_01,token);
    sVar4 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::size(this_01);
    if (sVar4 == 4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rg",&local_59);
      bVar2 = QPDFTokenizer::Token::isWord(token,&local_58);
      if (bVar2) {
        pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                           (this_01,0);
        if ((pvVar3->type == tt_real) || (pvVar3->type == tt_integer)) {
          pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                             (this_01,1);
          if ((pvVar3->type == tt_real) || (pvVar3->type == tt_integer)) {
            pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                               (this_01,2);
            tVar1 = pvVar3->type;
            std::__cxx11::string::~string((string *)&local_58);
            if ((tVar1 == tt_real) || (tVar1 == tt_integer)) {
              pCVar5 = (ColorToGray *)this_01;
              pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                                 (this_01,0);
              local_30 = numericValue(pCVar5,pvVar3);
              pCVar5 = (ColorToGray *)this_01;
              pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                                 (this_01,1);
              local_38 = numericValue(pCVar5,pvVar3);
              pCVar5 = (ColorToGray *)this_01;
              pvVar3 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at
                                 (this_01,2);
              dVar6 = numericValue(pCVar5,pvVar3);
              dVar7 = local_38 * 0.11 + local_30 * 0.3 + dVar6 * 0.59;
              dVar6 = 1.0;
              if (dVar7 <= 1.0) {
                dVar6 = dVar7;
              }
              dVar7 = 0.0;
              if (0.0 <= dVar6) {
                dVar7 = dVar6;
              }
              QUtil::double_to_string_abi_cxx11_(dVar7,(int)&local_58,true);
              QPDFObjectHandle::TokenFilter::write((string *)this);
              std::__cxx11::string::~string((string *)&local_58);
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_58," g",&local_59)
              ;
              QPDFObjectHandle::TokenFilter::write((string *)this);
              std::__cxx11::string::~string((string *)&local_58);
              std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::clear
                        (this_01);
              std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::clear
                        (this_00);
            }
            goto LAB_001037a5;
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
LAB_001037a5:
  sVar4 = std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::size
                    (&this->stack);
  if (sVar4 == 4) {
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::at(this_00,0);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(this_00);
    std::deque<QPDFTokenizer::Token,_std::allocator<QPDFTokenizer::Token>_>::pop_front(&this->stack)
    ;
  }
  return;
}

Assistant:

void
ColorToGray::handleToken(QPDFTokenizer::Token const& token)
{
    // Track the number of non-ignorable tokens we've seen. If we see an "rg" following three
    // numbers, convert it to a grayscale value. Keep writing tokens to the output as we can.

    // There are several things to notice here. We keep two stacks: one of "meaningful" tokens, and
    // one of all tokens. This way we can preserve whitespace or comments that we encounter in the
    // stream and there preserve layout. As we receive tokens, we keep the last four meaningful
    // tokens. If we see three numbers followed by rg, we use the three numbers to calculate a gray
    // value that is perceptually similar to the color value and then write the "g" operator to the
    // output, discarding any spaces or comments encountered embedded in the "rg" operator.

    // The stack and all_stack members are updated in such a way that they always contain exactly
    // the same non-ignorable tokens. The stack member contains the tokens that would be left if you
    // removed all space and comment tokens from all_stack.

    // On each new token, flush out any space or comment tokens. Store the incoming token. If we
    // just got an rg preceded by the right kinds of operands, replace the command. Flush any
    // additional accumulated tokens to keep the stack only four tokens deep.

    while ((!this->all_stack.empty()) && isIgnorable(this->all_stack.at(0).getType())) {
        writeToken(this->all_stack.at(0));
        this->all_stack.pop_front();
    }
    this->all_stack.push_back(token);
    QPDFTokenizer::token_type_e token_type = token.getType();
    if (!isIgnorable(token_type)) {
        this->stack.push_back(token);
        if ((this->stack.size() == 4) && token.isWord("rg") &&
            (isNumeric(this->stack.at(0).getType())) && (isNumeric(this->stack.at(1).getType())) &&
            (isNumeric(this->stack.at(2).getType()))) {
            double r = numericValue(this->stack.at(0));
            double g = numericValue(this->stack.at(1));
            double b = numericValue(this->stack.at(2));
            double gray = ((0.3 * r) + (0.59 * b) + (0.11 * g));
            if (gray > 1.0) {
                gray = 1.0;
            }
            if (gray < 0.0) {
                gray = 0.0;
            }
            write(QUtil::double_to_string(gray, 3));
            write(" g");
            this->stack.clear();
            this->all_stack.clear();
        }
    }
    if (this->stack.size() == 4) {
        writeToken(this->all_stack.at(0));
        this->all_stack.pop_front();
        this->stack.pop_front();
    }
}